

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatchesRegexMatcher::DescribeNegationTo(MatchesRegexMatcher *this,ostream *os)

{
  ostream *poVar1;
  element_type *this_00;
  char *pcVar2;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ostream *local_18;
  ostream *os_local;
  MatchesRegexMatcher *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  poVar1 = std::operator<<(os,"doesn\'t ");
  pcVar2 = "contain";
  if ((this->full_match_ & 1U) != 0) {
    pcVar2 = "match";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1," regular expression ");
  this_00 = std::
            __shared_ptr_access<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  pcVar2 = RE::pattern(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar2,&local_39);
  UniversalPrinter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Print(&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void DescribeNegationTo(::std::ostream* os) const {
    *os << "doesn't " << (full_match_ ? "match" : "contain")
        << " regular expression ";
    UniversalPrinter<std::string>::Print(regex_->pattern(), os);
  }